

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O3

Bend * __thiscall
OpenMD::MoleculeCreator::createBend
          (MoleculeCreator *this,ForceField *ff,Molecule *mol,BendStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  pointer ppAVar1;
  Atom *atom1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  int iVar5;
  BendType *pBVar6;
  Bend *this_00;
  long *plVar7;
  uint uVar8;
  Atom *pAVar9;
  size_type *psVar10;
  string s;
  vector<int,_std::allocator<int>_> bendAtoms;
  BendTypeParser btParser;
  string local_180;
  Atom *local_160;
  allocator<char> local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  string local_150;
  string local_130;
  long *local_110 [2];
  long local_100 [2];
  Atom *local_f0;
  vector<int,_std::allocator<int>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  vector<double,_std::allocator<double>_> local_b8;
  long *local_a0 [2];
  long local_90 [2];
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>_>
  local_60;
  
  BendTypeParser::BendTypeParser((BendTypeParser *)&local_60);
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,&stamp->members_);
  pAVar9 = (Atom *)((long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2);
  if (pAVar9 == (Atom *)0x2) {
    if ((stamp->GhostVectorSource).super_ParameterBase.empty_ == false) {
      uVar8 = *(uint *)&(stamp->GhostVectorSource).super_ParameterBase.field_0x2c;
      ppAVar1 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_160 = ppAVar1[(uint)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start
                                [uVar8 == *local_e8.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start]];
      pAVar9 = ppAVar1[uVar8];
      if (pAVar9 == (Atom *)0x0) {
LAB_001955ec:
        builtin_strncpy(painCave.errMsg,"Can not cast Atom to DirectionalAtom",0x25);
        painCave.isFatal = 1;
        simError();
        pAVar9 = (Atom *)0x0;
      }
      else {
        pAVar9 = (Atom *)__dynamic_cast(pAVar9,&Atom::typeinfo,&DirectionalAtom::typeinfo,0);
        if (pAVar9 == (Atom *)0x0) goto LAB_001955ec;
      }
      if (stamp->hasOverride_ == true) {
        pcVar2 = (stamp->orType_)._M_dataplus._M_p;
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_180,pcVar2,pcVar2 + (stamp->orType_)._M_string_length);
        std::vector<double,_std::allocator<double>_>::vector(&local_d0,&stamp->orPars_);
        pBVar6 = BendTypeParser::parseTypeAndPars((BendTypeParser *)&local_60,&local_180,&local_d0);
        if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        (*(local_160->super_StuntDouble)._vptr_StuntDouble[7])(&local_180);
        (*(pAVar9->super_StuntDouble)._vptr_StuntDouble[7])(&local_150,pAVar9);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"GHOST","");
        pBVar6 = ForceField::getBendType(ff,&local_180,&local_150,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if (pBVar6 == (BendType *)0x0) {
          (*(local_160->super_StuntDouble)._vptr_StuntDouble[7])(&local_180);
          _Var3._M_p = local_180._M_dataplus._M_p;
          (*(pAVar9->super_StuntDouble)._vptr_StuntDouble[7])(&local_150,pAVar9);
          snprintf(painCave.errMsg,2000,"Can not find Matching Bend Type for[%s, %s, %s]",_Var3._M_p
                   ,local_150._M_dataplus._M_p,"GHOST");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          painCave.isFatal = 1;
          simError();
          pBVar6 = (BendType *)0x0;
        }
      }
      this_00 = (Bend *)operator_new(0x98);
      Bend::Bend(this_00,local_160,pAVar9,pAVar9,pBVar6);
      (this_00->super_ShortRangeInteraction)._vptr_ShortRangeInteraction =
           (_func_int **)&PTR__Bend_002fa890;
      goto LAB_00195843;
    }
  }
  else if (pAVar9 == (Atom *)0x3) {
    ppAVar1 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    atom1 = ppAVar1[(uint)*local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start];
    pAVar9 = ppAVar1[(uint)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[1]];
    local_160 = ppAVar1[(uint)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[2]];
    local_f0 = pAVar9;
    if (stamp->hasOverride_ == true) {
      pcVar2 = (stamp->orType_)._M_dataplus._M_p;
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_180,pcVar2,pcVar2 + (stamp->orType_)._M_string_length);
      std::vector<double,_std::allocator<double>_>::vector(&local_b8,&stamp->orPars_);
      pBVar6 = BendTypeParser::parseTypeAndPars((BendTypeParser *)&local_60,&local_180,&local_b8);
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      (*(atom1->super_StuntDouble)._vptr_StuntDouble[7])(&local_150,atom1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,local_150._M_dataplus._M_p,&local_151);
      (*(pAVar9->super_StuntDouble)._vptr_StuntDouble[7])(local_110,pAVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,(char *)local_110[0],&local_152);
      (*(local_160->super_StuntDouble)._vptr_StuntDouble[7])(local_a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,(char *)local_a0[0],&local_153);
      pBVar6 = ForceField::getBendType(ff,&local_180,&local_130,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0],local_90[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if (local_110[0] != local_100) {
        operator_delete(local_110[0],local_100[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if (pBVar6 == (BendType *)0x0) {
        (*(atom1->super_StuntDouble)._vptr_StuntDouble[7])(&local_180,atom1);
        _Var3._M_p = local_180._M_dataplus._M_p;
        (*(local_f0->super_StuntDouble)._vptr_StuntDouble[7])(&local_150);
        _Var4._M_p = local_150._M_dataplus._M_p;
        (*(local_160->super_StuntDouble)._vptr_StuntDouble[7])(&local_130);
        snprintf(painCave.errMsg,2000,"Can not find Matching Bend Type for[%s, %s, %s]",_Var3._M_p,
                 _Var4._M_p,local_130._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        painCave.isFatal = 1;
        simError();
        pBVar6 = (BendType *)0x0;
      }
    }
    this_00 = (Bend *)operator_new(0x98);
    pAVar9 = local_160;
    Bend::Bend(this_00,atom1,local_f0,local_160,pBVar6);
    goto LAB_00195843;
  }
  this_00 = (Bend *)0x0;
LAB_00195843:
  uVar8 = (uint)pAVar9;
  iVar5 = IndexListContainer::pop(&localIndexMan->bendIndexContainer_);
  (this_00->super_ShortRangeInteraction).localIndex_ = iVar5;
  OpenMD_itoa_abi_cxx11_
            (&local_180,
             (OpenMD *)
             ((ulong)((long)(mol->bends_).
                            super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(mol->bends_).
                           super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3),10,uVar8);
  pcVar2 = (mol->molStamp_->Name).data_._M_dataplus._M_p;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_110,pcVar2,pcVar2 + (mol->molStamp_->Name).data_._M_string_length);
  plVar7 = (long *)std::__cxx11::string::append((char *)local_110);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_130.field_2._M_allocated_capacity = *psVar10;
    local_130.field_2._8_8_ = plVar7[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar10;
    local_130._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_130._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_150.field_2._M_allocated_capacity = *psVar10;
    local_150.field_2._8_4_ = (undefined4)plVar7[3];
    local_150.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar10;
    local_150._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_150._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  (*(this_00->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[3])(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((uint *)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (uint *)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>_>
  ::~_Rb_tree(&local_60);
  return this_00;
}

Assistant:

Bend* MoleculeCreator::createBend(ForceField* ff, Molecule* mol,
                                    BendStamp* stamp,
                                    LocalIndexManager* localIndexMan) {
    BendTypeParser btParser;
    BendType* bendType = NULL;
    Bend* bend         = NULL;

    std::vector<int> bendAtoms = stamp->getMembers();
    if (bendAtoms.size() == 3) {
      Atom* atomA = mol->getAtomAt(bendAtoms[0]);
      Atom* atomB = mol->getAtomAt(bendAtoms[1]);
      Atom* atomC = mol->getAtomAt(bendAtoms[2]);

      assert(atomA && atomB && atomC);

      if (stamp->hasOverride()) {
        try {
          bendType = btParser.parseTypeAndPars(stamp->getOverrideType(),
                                               stamp->getOverridePars());
        } catch (OpenMDException& e) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MoleculeCreator Error: %s "
                   "for molecule %s\n",
                   e.what(), mol->getType().c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        bendType =
            ff->getBendType(atomA->getType().c_str(), atomB->getType().c_str(),
                            atomC->getType().c_str());

        if (bendType == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not find Matching Bend Type for[%s, %s, %s]",
                   atomA->getType().c_str(), atomB->getType().c_str(),
                   atomC->getType().c_str());

          painCave.isFatal = 1;
          simError();
        }
      }

      bend = new Bend(atomA, atomB, atomC, bendType);

    } else if (bendAtoms.size() == 2 && stamp->haveGhostVectorSource()) {
      int ghostIndex = stamp->getGhostVectorSource();
      int normalIndex =
          ghostIndex != bendAtoms[0] ? bendAtoms[0] : bendAtoms[1];
      Atom* normalAtom = mol->getAtomAt(normalIndex);
      DirectionalAtom* ghostAtom =
          dynamic_cast<DirectionalAtom*>(mol->getAtomAt(ghostIndex));
      if (ghostAtom == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not cast Atom to DirectionalAtom");
        painCave.isFatal = 1;
        simError();
      }

      if (stamp->hasOverride()) {
        try {
          bendType = btParser.parseTypeAndPars(stamp->getOverrideType(),
                                               stamp->getOverridePars());
        } catch (OpenMDException& e) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MoleculeCreator Error: %s "
                   "for molecule %s\n",
                   e.what(), mol->getType().c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        bendType = ff->getBendType(normalAtom->getType(), ghostAtom->getType(),
                                   "GHOST");

        if (bendType == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not find Matching Bend Type for[%s, %s, %s]",
                   normalAtom->getType().c_str(), ghostAtom->getType().c_str(),
                   "GHOST");

          painCave.isFatal = 1;
          simError();
        }
      }

      bend = new GhostBend(normalAtom, ghostAtom, bendType);
    }

    // set the local index of this bend, the global index will be set later
    bend->setLocalIndex(localIndexMan->getNextBendIndex());

    // The rule for naming a bend is: MoleculeName_Bend_Integer
    // The first part is the name of the molecule
    // The second part is always fixed as "Bend"
    // The third part is the index of the bend defined in meta-data file
    // For example, Butane_Bend_0 is a valid Bend name in a butane molecule

    std::string s = OpenMD_itoa(mol->getNBends(), 10);
    bend->setName(mol->getType() + "_Bend_" + s.c_str());
    return bend;
  }